

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O3

bool duckdb::TryDecimalStringCast<int,(char)46>
               (char *string_ptr,idx_t string_size,int *result,CastParameters *parameters,
               uint8_t width,uint8_t scale)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  idx_t iVar8;
  byte bVar9;
  byte bVar10;
  undefined7 uVar13;
  ulong uVar11;
  char *pcVar12;
  byte bVar14;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  int params_2;
  ulong in_R11;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint params_1;
  uint uVar19;
  string error;
  DecimalCastData<int> local_d8;
  undefined4 local_c8;
  undefined4 local_c4;
  int *local_c0;
  ulong local_b8;
  ulong local_b0;
  string local_a8;
  uint local_88;
  undefined4 uStack_84;
  undefined8 uStack_80;
  CastParameters *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  params_2 = CONCAT31(in_register_00000089,scale);
  local_d8.result = 0;
  local_d8.digit_count = '\0';
  local_d8.decimal_count = '\0';
  local_d8.round_set = false;
  local_d8.should_round = false;
  local_d8.excessive_decimals = '\0';
  local_d8.exponent_type = NONE;
  local_d8.limit =
       *(StoreType_conflict *)
        (NumericHelper::POWERS_OF_TEN + (CONCAT71(in_register_00000081,width) & 0xffffffff) * 8);
  uVar6 = (uint)width;
  params_1 = (uint)scale;
  uVar19 = (uint)string_size;
  local_d8.width = width;
  local_d8.scale = scale;
  local_78 = parameters;
  if (string_size != 0) {
    uVar7 = 0;
    do {
      bVar9 = string_ptr[uVar7];
      uVar4 = (uint)bVar9;
      if ((4 < uVar4 - 9) && (uVar4 != 0x20)) {
        if (uVar4 == 0x2d) {
          if (string_size - 1 != uVar7) {
            uVar3 = string_size - uVar7;
            uVar5 = 1;
            bVar9 = 0;
            local_d8.result = 0;
            goto LAB_002a92f2;
          }
          DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,true>(&local_d8);
          break;
        }
        if (bVar9 == 0x30 && string_size - 1 != uVar7) {
          bVar14 = string_ptr[uVar7 + 1];
          if (bVar14 < 0x62) {
            if ((bVar14 != 0x42) && (bVar14 != 0x58)) goto LAB_002a93c0;
          }
          else if ((bVar14 != 0x62) && (bVar14 != 0x78)) goto LAB_002a93c0;
          if ((string_size - uVar7) - 3 < 0xfffffffffffffffe) break;
        }
        else {
LAB_002a93c0:
          uVar3 = string_size - uVar7;
          uVar5 = (ulong)(bVar9 == 0x2b);
          if (uVar5 < uVar3) {
            local_d8._6_4_ = 0;
            local_d8.result = 0;
            uVar16 = uVar5;
            goto LAB_002a93f0;
          }
        }
        DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,false>(&local_d8);
        break;
      }
      uVar7 = uVar7 + 1;
    } while (string_size != uVar7);
    goto LAB_002a949d;
  }
  local_88 = 0;
  goto LAB_002a94d5;
  while( true ) {
    if (string_ptr[uVar7 + 1 + uVar5] == '_') {
      if (((string_size - uVar5) - 2 == uVar7) ||
         (uVar5 = uVar5 + 2, 9 < (byte)(string_ptr[uVar7 + uVar5] - 0x30U))) goto LAB_002a9495;
    }
    else {
      uVar5 = uVar5 + 1;
    }
    uVar17 = uVar5;
    if (uVar3 <= uVar5) break;
LAB_002a92f2:
    bVar10 = string_ptr[uVar7 + uVar5];
    bVar14 = bVar10 - 0x30;
    if (9 < bVar14) {
      local_d8._7_3_ = 0;
      local_d8.digit_count = bVar9;
      uVar16 = uVar5;
      if (bVar10 != 0x2e) goto LAB_002a984e;
      uVar15 = uVar5 + 1;
      uVar17 = uVar15;
      if (uVar3 <= uVar15) goto LAB_002a9923;
      uVar11 = 0;
      local_b8 = CONCAT44(local_b8._4_4_,(uint)bVar9);
      local_c4 = 0;
      local_c8 = 0;
      bVar14 = 0;
      uVar16 = uVar15;
      goto LAB_002a95f1;
    }
    if (bVar14 == 0 && local_d8.result == 0) {
      local_d8.result = 0;
    }
    else {
      if ((uVar6 - params_1 == (uint)bVar9) || (bVar9 = bVar9 + 1, local_d8.result < -0xccccccc))
      goto LAB_002a9495;
      local_d8.result = local_d8.result * 10 - (uint)bVar14;
    }
    uVar17 = uVar3;
    if (~uVar5 + string_size == uVar7) break;
  }
  local_d8._7_3_ = 0;
  local_d8.digit_count = bVar9;
LAB_002a96b2:
  local_c0 = result;
  bVar2 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,true>(&local_d8);
  if ((bVar2) && (1 < uVar17)) goto LAB_002a97ef;
  goto LAB_002a949d;
  while( true ) {
    if (string_ptr[uVar7 + 1 + uVar16] == '_') {
      if ((string_size - uVar16) - 2 == uVar7) goto LAB_002a97fb;
      uVar16 = uVar16 + 2;
      bVar10 = (string_ptr + uVar16)[uVar7] - 0x30;
      uVar11 = CONCAT71((int7)((ulong)(string_ptr + uVar16) >> 8),bVar10);
      if (9 < bVar10) goto LAB_002a97fb;
    }
    else {
      uVar16 = uVar16 + 1;
    }
    uVar17 = uVar16;
    if (uVar3 <= uVar16) break;
LAB_002a95f1:
    bVar10 = string_ptr[uVar7 + uVar16];
    bVar1 = bVar10 - 0x30;
    local_b0 = uVar15;
    if (9 < bVar1) {
      local_d8.decimal_count = bVar14;
      local_d8.round_set = local_c8._0_1_;
      local_d8.should_round = (bool)(char)local_c4;
      local_c0 = result;
      if (uVar15 < uVar16 || 1 < uVar5) goto LAB_002a984e;
      goto LAB_002a949d;
    }
    if ((bVar14 == scale) && (local_c8._0_1_ == false)) {
      uVar13 = (undefined7)(uVar11 >> 8);
      local_c4 = (undefined4)CONCAT71(uVar13,4 < bVar1);
      local_c8 = (undefined4)CONCAT71(uVar13,1);
    }
    bVar2 = (uint)bVar14 + (uint)bVar9 < 9;
    if (bVar2) {
      local_d8.result = local_d8.result * 10 - (uint)bVar1;
    }
    bVar14 = bVar14 + bVar2;
    uVar11 = ~uVar16 + string_size;
    uVar17 = uVar3;
    if (uVar11 == uVar7) break;
  }
  local_d8.decimal_count = bVar14;
  local_d8.round_set = SUB41(local_c8,0);
  local_d8.should_round = (bool)(char)local_c4;
LAB_002a9923:
  if ((1 < uVar5) || (local_c0 = result, uVar15 < uVar17)) goto LAB_002a96b2;
  goto LAB_002a949d;
LAB_002a984e:
  uVar4 = (uint)bVar10;
  if (bVar10 < 0x20) {
    local_c0 = result;
    if (uVar4 - 9 < 5) {
LAB_002a9863:
      uVar16 = uVar16 + 1;
      uVar17 = uVar16;
      if (uVar16 < uVar3) {
        do {
          if ((4 < (byte)string_ptr[uVar7 + uVar16] - 9) &&
             (local_c0 = result, string_ptr[uVar7 + uVar16] != 0x20)) goto LAB_002a949d;
          uVar16 = uVar16 + 1;
          uVar17 = uVar3;
        } while (uVar3 != uVar16);
      }
      goto LAB_002a96b2;
    }
  }
  else if ((bVar10 == 0x65) || (uVar4 == 0x45)) {
    local_c0 = result;
    if ((uVar16 != 1) && (uVar16 + 1 < uVar3)) {
      local_a8._M_dataplus._M_p._0_2_ = 0;
      pcVar12 = string_ptr + uVar7 + uVar16 + 1;
      iVar8 = ~uVar7 + (string_size - uVar16);
      if (*pcVar12 == '-') {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar12,iVar8,(IntegerCastData<short> *)&local_a8,false);
      }
      else {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar12,iVar8,(IntegerCastData<short> *)&local_a8,false);
      }
      if (bVar2 != false) {
        bVar2 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<int>,true>
                          (&local_d8,(int)(short)local_a8._M_dataplus._M_p);
        goto LAB_002a9a9e;
      }
    }
  }
  else {
    local_c0 = result;
    if (uVar4 == 0x20) goto LAB_002a9863;
  }
  goto LAB_002a949d;
  while( true ) {
    if (string_ptr[uVar7 + 1 + uVar16] == '_') {
      if (((string_size - uVar16) - 2 == uVar7) ||
         (uVar16 = uVar16 + 2, 9 < (byte)(string_ptr[uVar7 + uVar16] - 0x30U))) goto LAB_002a9495;
    }
    else {
      uVar16 = uVar16 + 1;
    }
    uVar18 = uVar16;
    if (uVar3 <= uVar16) break;
LAB_002a93f0:
    bVar9 = (byte)local_d8._6_4_;
    uVar15 = CONCAT71((int7)(in_R11 >> 8),string_ptr[uVar7 + uVar16]);
    uVar4 = (uint)uVar15;
    bVar14 = (byte)(uVar4 - 0x30);
    local_b8 = uVar5;
    if (9 < bVar14) {
      uVar17 = uVar16;
      if (string_ptr[uVar7 + uVar16] != '.') goto LAB_002a9972;
      uVar11 = uVar16 + 1;
      uVar18 = uVar11;
      if (uVar3 <= uVar11) goto LAB_002a9a41;
      local_c4 = 0;
      local_c8 = 0;
      bVar14 = 0;
      uVar17 = uVar11;
      goto LAB_002a971a;
    }
    if (bVar14 == 0 && local_d8.result == 0) {
      local_d8.result = 0;
    }
    else {
      if (uVar6 - params_1 == local_d8._6_4_) goto LAB_002a9495;
      bVar9 = bVar9 + 1;
      local_d8._6_4_ = ZEXT14(bVar9);
      if (0xccccccc < local_d8.result) goto LAB_002a9495;
      local_d8.result = (uVar4 - 0x30 & 0xff) + local_d8.result * 10;
    }
    bVar9 = (byte)local_d8._6_4_;
    in_R11 = ~uVar16 + string_size;
    uVar18 = uVar3;
    if (in_R11 == uVar7) break;
  }
LAB_002a97d4:
  local_c0 = result;
  bVar2 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,false>(&local_d8);
  if ((bVar2) && (local_b8 < uVar18)) {
LAB_002a97ef:
    *result = local_d8.result;
    return true;
  }
  goto LAB_002a949d;
LAB_002a97fb:
  local_d8.decimal_count = bVar14;
  local_d8.round_set = SUB41(local_c8,0);
  local_d8.should_round = (bool)(char)local_c4;
  local_c0 = result;
  goto LAB_002a949d;
LAB_002a9972:
  uVar4 = uVar4 & 0xff;
  if (uVar4 < 0x20) {
    local_c0 = result;
    if (uVar4 - 9 < 5) {
LAB_002a9987:
      uVar17 = uVar17 + 1;
      uVar18 = uVar17;
      if (uVar17 < uVar3) {
        do {
          if ((4 < (byte)string_ptr[uVar7 + uVar17] - 9) &&
             (local_c0 = result, string_ptr[uVar7 + uVar17] != 0x20)) goto LAB_002a949d;
          uVar17 = uVar17 + 1;
          uVar18 = uVar3;
        } while (uVar3 != uVar17);
      }
      goto LAB_002a97d4;
    }
  }
  else if ((uVar4 == 0x65) || (uVar4 == 0x45)) {
    local_c0 = result;
    if ((uVar17 != uVar5) && (uVar17 + 1 < uVar3)) {
      local_a8._M_dataplus._M_p._0_2_ = 0;
      pcVar12 = string_ptr + uVar7 + uVar17 + 1;
      iVar8 = ~uVar7 + (string_size - uVar17);
      if (*pcVar12 == '-') {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar12,iVar8,(IntegerCastData<short> *)&local_a8,false);
      }
      else {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar12,iVar8,(IntegerCastData<short> *)&local_a8,false);
      }
      if (bVar2 != false) {
        bVar2 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<int>,false>
                          (&local_d8,(int)(short)local_a8._M_dataplus._M_p);
LAB_002a9a9e:
        result = local_c0;
        if (bVar2 != false) goto LAB_002a97ef;
      }
    }
  }
  else {
    local_c0 = result;
    if (uVar4 == 0x20) goto LAB_002a9987;
  }
  goto LAB_002a949d;
LAB_002a9495:
  local_d8._7_3_ = 0;
  local_d8.digit_count = bVar9;
  local_c0 = result;
  goto LAB_002a949d;
  while( true ) {
    if (string_ptr[uVar7 + 1 + uVar17] == '_') {
      if (((string_size - uVar17) - 2 == uVar7) ||
         (uVar17 = uVar17 + 2, 9 < (byte)(string_ptr[uVar7 + uVar17] - 0x30U))) goto LAB_002a97fb;
    }
    else {
      uVar17 = uVar17 + 1;
    }
    uVar18 = uVar17;
    if (uVar3 <= uVar17) break;
LAB_002a971a:
    uVar13 = (undefined7)(uVar15 >> 8);
    uVar4 = (uint)CONCAT71(uVar13,string_ptr[uVar7 + uVar17]);
    bVar10 = (byte)(uVar4 - 0x30);
    local_b0 = uVar11;
    if (9 < bVar10) {
      local_d8.decimal_count = bVar14;
      local_d8.digit_count = bVar9;
      local_d8.round_set = local_c8._0_1_;
      local_d8.should_round = (bool)(char)local_c4;
      local_c0 = result;
      if (uVar11 < uVar17 || uVar5 < uVar16) goto LAB_002a9972;
      goto LAB_002a949d;
    }
    if ((bVar14 == scale) && (local_c8._0_1_ == false)) {
      local_c4 = (undefined4)CONCAT71(uVar13,4 < bVar10);
      local_c8 = (undefined4)CONCAT71(uVar13,1);
    }
    bVar2 = (uint)bVar14 + local_d8._6_4_ < 9;
    uVar15 = (ulong)(uint)(local_d8.result * 5);
    if (bVar2) {
      local_d8.result = (uVar4 - 0x30 & 0xff) + local_d8.result * 10;
    }
    bVar14 = bVar14 + bVar2;
    uVar18 = uVar3;
    if (~uVar17 + string_size == uVar7) break;
  }
  local_d8.decimal_count = bVar14;
  local_d8.digit_count = bVar9;
  local_d8.round_set = SUB41(local_c8,0);
  local_d8.should_round = (bool)(char)local_c4;
LAB_002a9a41:
  if ((uVar5 < uVar16) || (local_c0 = result, uVar11 < uVar18)) goto LAB_002a97d4;
LAB_002a949d:
  local_88 = uVar19;
  if (uVar19 < 0xd) {
    uStack_80._4_4_ = 0;
    uStack_84 = 0;
    uStack_80._0_4_ = 0;
    if (uVar19 == 0) {
LAB_002a94d5:
      uStack_80._4_4_ = 0;
      uStack_80._0_4_ = 0;
      uStack_84 = 0;
      string_size = 0;
    }
    else {
      switchD_00b041bd::default(&uStack_84,string_ptr,(ulong)(uVar19 & 0xf));
    }
    string_ptr = (char *)&uStack_84;
    uStack_80 = (char *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
  }
  else {
    uStack_84 = *(undefined4 *)string_ptr;
    uStack_80 = string_ptr;
  }
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Could not convert string \"%s\" to DECIMAL(%d,%d)","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,string_ptr,string_ptr + (string_size & 0xffffffff));
  StringUtil::Format<std::__cxx11::string,int,int>
            (&local_a8,(StringUtil *)local_70,&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar6,
             params_1,params_2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  HandleCastError::AssignError(&local_a8,local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT62(local_a8._M_dataplus._M_p._2_6_,(short)local_a8._M_dataplus._M_p) !=
      &local_a8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT62(local_a8._M_dataplus._M_p._2_6_,(short)local_a8._M_dataplus._M_p));
  }
  return false;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, CastParameters &parameters,
                          uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		string_t value(string_ptr, (uint32_t)string_size);
		string error = StringUtil::Format("Could not convert string \"%s\" to DECIMAL(%d,%d)", value.GetString(),
		                                  (int)width, (int)scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = state.result;
	return true;
}